

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O2

void __thiscall
optimization::common_expr_del::Common_Expr_Del::Common_Expr_Del
          (Common_Expr_Del *this,bool offset_inst)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_11;
  
  (this->super_MirOptimizePass)._vptr_MirOptimizePass =
       (_func_int **)&PTR_pass_name_abi_cxx11__001d94a8;
  this->offset_inst = offset_inst;
  (this->mergeable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mergeable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->mergeable_funcs)._M_t._M_impl.super__Rb_tree_header;
  (this->mergeable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mergeable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->mergeable_funcs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->name,"Common expression delete",&local_11);
  return;
}

Assistant:

Common_Expr_Del(bool offset_inst = false) : offset_inst(offset_inst) {}